

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndp.h
# Opt level: O1

Factor * __thiscall libDAI::NDP::GetFactor(NDP *this,size_t i)

{
  pointer pTVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar3;
  ulong uVar4;
  
  iVar2 = (*(this->_g->super_GraphicalModel)._vptr_GraphicalModel[9])();
  uVar4 = i - CONCAT44(extraout_var,iVar2);
  if (i < CONCAT44(extraout_var,iVar2)) {
    iVar2 = (*(this->_g->super_GraphicalModel)._vptr_GraphicalModel[10])(this->_g,i);
    return (Factor *)CONCAT44(extraout_var_00,iVar2);
  }
  pTVar1 = (this->_m_newFacs).
           super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->_m_newFacs).
                 super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 3) *
          0x6db6db6db6db6db7;
  if (uVar4 <= uVar3 && uVar3 - uVar4 != 0) {
    return pTVar1 + uVar4;
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

const Factor & GetFactor(size_t i) const
            {
                //nr of Original Factors:
                size_t nrOFs = _g->nrFactors();
                if(i < nrOFs)
                    return (_g->factor(i));
                else
                    return ( _m_newFacs.at(i - nrOFs) );
            }